

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O1

void __thiscall
ActionQueue::AddAction(ActionQueue *this,PacketReader *reader,double time,bool auto_queue)

{
  pointer pcVar1;
  ActionQueue_Action *pAVar2;
  PacketReader local_50;
  ActionQueue_Action *local_28;
  
  pAVar2 = (ActionQueue_Action *)operator_new(0x38);
  local_50.data._M_dataplus._M_p = (pointer)&local_50.data.field_2;
  pcVar1 = (reader->data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (reader->data)._M_string_length);
  local_50.pos = reader->pos;
  (pAVar2->reader).data._M_dataplus._M_p = (pointer)&(pAVar2->reader).data.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pAVar2,local_50.data._M_dataplus._M_p,
             local_50.data._M_dataplus._M_p + local_50.data._M_string_length);
  (pAVar2->reader).pos = local_50.pos;
  pAVar2->time = time;
  pAVar2->auto_queue = auto_queue;
  local_28 = pAVar2;
  std::
  deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>
  ::emplace_back<ActionQueue_Action*>
            ((deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>
              *)this,&local_28);
  PacketReader::~PacketReader(&local_50);
  return;
}

Assistant:

void ActionQueue::AddAction(const PacketReader& reader, double time, bool auto_queue)
{
	this->queue.emplace(new ActionQueue_Action(reader, time, auto_queue));
}